

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O0

int AsmFuncts::getType(string *op)

{
  __type_conflict _Var1;
  size_type sVar2;
  reference pvVar3;
  int in_ECX;
  int local_44;
  int local_40;
  int i_2;
  int i_1;
  int i;
  string *local_18;
  string *op_local;
  
  local_18 = op;
  Conversion::decToBin_abi_cxx11_((string *)&i_1,(Conversion *)0x0,6,in_ECX);
  _Var1 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &i_1);
  std::__cxx11::string::~string((string *)&i_1);
  if (_Var1) {
    op_local._4_4_ = 1;
  }
  else {
    for (i_2 = 0; sVar2 = std::
                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::size(&Codes::typeROp_abi_cxx11_), (ulong)(long)i_2 < sVar2;
        i_2 = i_2 + 1) {
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Codes::typeROp_abi_cxx11_,(long)i_2);
      _Var1 = std::operator==(op,&pvVar3->first);
      if (_Var1) {
        return 1;
      }
    }
    for (local_40 = 0;
        sVar2 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size(&Codes::typeIOp_abi_cxx11_), (ulong)(long)local_40 < sVar2;
        local_40 = local_40 + 1) {
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Codes::typeIOp_abi_cxx11_,(long)local_40);
      _Var1 = std::operator==(op,&pvVar3->first);
      if (_Var1) {
        return 2;
      }
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Codes::typeIOp_abi_cxx11_,(long)local_40);
      _Var1 = std::operator==(op,&pvVar3->second);
      if (_Var1) {
        return 2;
      }
    }
    for (local_44 = 0;
        sVar2 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size(&Codes::typeJOp_abi_cxx11_), (ulong)(long)local_44 < sVar2;
        local_44 = local_44 + 1) {
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Codes::typeJOp_abi_cxx11_,(long)local_44);
      _Var1 = std::operator==(op,&pvVar3->first);
      if (_Var1) {
        return 3;
      }
      pvVar3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Codes::typeJOp_abi_cxx11_,(long)local_44);
      _Var1 = std::operator==(op,&pvVar3->second);
      if (_Var1) {
        return 3;
      }
    }
    op_local._4_4_ = -1;
  }
  return op_local._4_4_;
}

Assistant:

int AsmFuncts::getType(string op){
    if(op == Conversion::decToBin(0,6))
        return TYPE_R;
    for (int i = 0; i < Codes::typeROp.size(); i++)
        if((op == Codes::typeROp[i].first))
            return TYPE_R;

    for (int i = 0; i < Codes::typeIOp.size(); i++)
        if((op == Codes::typeIOp[i].first) || (op == Codes::typeIOp[i].second))
            return TYPE_I;

    for (int i = 0; i < Codes::typeJOp.size(); i++)
        if((op == Codes::typeJOp[i].first) || (op == Codes::typeJOp[i].second))
            return TYPE_J;
    return -1;
}